

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseOtherStatement(ParserImpl *this)

{
  TokenDetail *pTVar1;
  undefined8 uVar2;
  PrefixExpType *in_RSI;
  tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_> in_RDI;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp_list;
  unique_ptr<luna::VarList,_std::default_delete<luna::VarList>_> var_list;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp;
  int start_line;
  PrefixExpType type;
  pointer in_stack_ffffffffffffff38;
  ParserImpl *in_stack_ffffffffffffff40;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *this_00;
  unique_ptr<luna::VarList,_std::default_delete<luna::VarList>_> *in_stack_ffffffffffffff48;
  int start_line_00;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff50;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff58;
  AssignmentStatement *in_stack_ffffffffffffff60;
  undefined1 local_58 [8];
  _Head_base<0UL,_luna::SyntaxTree_*,_false> in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  ParseException *in_stack_ffffffffffffffc0;
  ParserImpl *in_stack_ffffffffffffffd8;
  int local_14;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> this_01;
  
  this_01._M_head_impl =
       (SyntaxTree *)
       in_RDI.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
       super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  LookAhead(in_stack_ffffffffffffff40);
  ParsePrefixExp((ParserImpl *)this_01._M_head_impl,in_RSI);
  if (local_14 == 1) {
    operator_new(0x20);
    luna::VarList::VarList((VarList *)in_stack_ffffffffffffff40);
    std::unique_ptr<luna::VarList,std::default_delete<luna::VarList>>::
    unique_ptr<std::default_delete<luna::VarList>,void>
              ((unique_ptr<luna::VarList,_std::default_delete<luna::VarList>_> *)
               in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::unique_ptr<luna::VarList,_std::default_delete<luna::VarList>_>::operator->
              ((unique_ptr<luna::VarList,_std::default_delete<luna::VarList>_> *)0x188216);
    std::
    vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
    ::push_back((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                 *)in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
    while (pTVar1 = LookAhead(in_stack_ffffffffffffff40), pTVar1->token_ != 0x3d) {
      pTVar1 = LookAhead(in_stack_ffffffffffffff40);
      if (pTVar1->token_ != 0x2c) {
        uVar2 = __cxa_allocate_exception(0x20);
        luna::ParseException::ParseException
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   (TokenDetail *)in_stack_ffffffffffffffb0._M_head_impl);
        __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
      }
      NextToken(in_stack_ffffffffffffff40);
      ParsePrefixExp((ParserImpl *)this_01._M_head_impl,in_RSI);
      std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
                ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                 in_stack_ffffffffffffff40,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                 in_stack_ffffffffffffff38);
      std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                (in_stack_ffffffffffffff50);
      std::unique_ptr<luna::VarList,_std::default_delete<luna::VarList>_>::operator->
                ((unique_ptr<luna::VarList,_std::default_delete<luna::VarList>_> *)0x1883fc);
      std::
      vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
      ::push_back((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                   *)in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
    }
    NextToken(in_stack_ffffffffffffff40);
    ParseExpList(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffff50 =
         (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)operator_new(0x28);
    this_00 = (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
              &stack0xffffffffffffffb0;
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<luna::VarList,std::default_delete<luna::VarList>,void>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    start_line_00 = (int)((ulong)local_58 >> 0x20);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              (this_00,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_ffffffffffffff38);
    luna::AssignmentStatement::AssignmentStatement
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               start_line_00);
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>
              (this_00,&in_stack_ffffffffffffff38->super_SyntaxTree);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff50);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff50);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff50);
    std::unique_ptr<luna::VarList,_std::default_delete<luna::VarList>_>::~unique_ptr
              ((unique_ptr<luna::VarList,_std::default_delete<luna::VarList>_> *)this_00);
  }
  else {
    if (local_14 != 2) {
      uVar2 = __cxa_allocate_exception(0x20);
      luna::ParseException::ParseException
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 (TokenDetail *)in_stack_ffffffffffffffb0._M_head_impl);
      __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
    }
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff40,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff38);
  }
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_ffffffffffffff50);
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseOtherStatement()
        {
            PrefixExpType type;
            int start_line = LookAhead().line_;
            std::unique_ptr<SyntaxTree> exp = ParsePrefixExp(&type);

            if (type == PrefixExpType_Var)
            {
                std::unique_ptr<VarList> var_list(new VarList);
                var_list->var_list_.push_back(std::move(exp));

                while (LookAhead().token_ != '=')
                {
                    if (LookAhead().token_ != ',')
                        throw ParseException("expect ',' to split var", look_ahead_);
                    NextToken();        // skip ','
                    exp = ParsePrefixExp(&type);
                    if (type != PrefixExpType_Var)
                        throw ParseException("expect var here", current_);
                    var_list->var_list_.push_back(std::move(exp));
                }

                NextToken();            // skip '='
                std::unique_ptr<SyntaxTree> exp_list = ParseExpList();
                return std::unique_ptr<SyntaxTree>(new AssignmentStatement(std::move(var_list),
                                                                           std::move(exp_list),
                                                                           start_line));
            }
            else if (type == PrefixExpType_Functioncall)
                return exp;
            else
                throw ParseException("incomplete statement", current_);

            assert(!"unreachable");
            return std::unique_ptr<SyntaxTree>();
        }